

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall
de::Random::
choose<std::_Rb_tree_const_iterator<unsigned_int>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          (Random *this,_Rb_tree_const_iterator<unsigned_int> first,
          _Rb_tree_const_iterator<unsigned_int> last,
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          result,int numItems)

{
  uint uVar1;
  bool bVar2;
  reference puVar3;
  reference puVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  int local_3c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  _Stack_38;
  int r;
  int local_30;
  int local_2c;
  int ndx;
  int numItems_local;
  Random *this_local;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  result_local;
  _Rb_tree_const_iterator<unsigned_int> last_local;
  _Rb_tree_const_iterator<unsigned_int> first_local;
  
  local_30 = 0;
  local_2c = numItems;
  _ndx = this;
  this_local = (Random *)result._M_current;
  result_local._M_current = &(last._M_node)->_M_color;
  last_local._M_node = first._M_node;
  while (bVar2 = std::operator!=(&last_local,(_Self *)&result_local), bVar2) {
    if (local_30 < local_2c) {
      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&last_local);
      uVar1 = *puVar3;
      _Stack_38 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&this_local,(long)local_30);
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&stack0xffffffffffffffc8);
      *puVar4 = uVar1;
    }
    else {
      local_3c = getInt(this,0,local_30);
      if (local_3c < local_2c) {
        puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&last_local);
        uVar1 = *puVar3;
        local_48 = __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&this_local,(long)local_3c);
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_48);
        *puVar4 = uVar1;
      }
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&last_local);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}